

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprIfFalse(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  uint uVar1;
  uint uVar2;
  int in2;
  int iVar3;
  Expr *pExpr_00;
  int destIfNull;
  int isTrue;
  int isNot;
  int d2;
  Expr *pAlt;
  int r2;
  int r1;
  int regFree2;
  int regFree1;
  int op;
  Vdbe *v;
  int jumpIfNull_local;
  int dest_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  _regFree1 = pParse->pVdbe;
  r1 = 0;
  r2 = 0;
  if (_regFree1 == (Vdbe *)0x0) {
    return;
  }
  if (pExpr == (Expr *)0x0) {
    return;
  }
  regFree2 = pExpr->op ^ 1;
  v._0_4_ = jumpIfNull;
  v._4_4_ = dest;
  _jumpIfNull_local = pExpr;
  pExpr_local = (Expr *)pParse;
  switch(pExpr->op) {
  case '\x13':
    sqlite3ExprIfTrue(pParse,pExpr->pLeft,dest,jumpIfNull);
    break;
  default:
    goto LAB_0022f291;
  case '+':
  case ',':
    pExpr_00 = sqlite3ExprSimplifiedAndOr(pExpr);
    if (pExpr_00 == _jumpIfNull_local) {
      if (_jumpIfNull_local->op == ',') {
        sqlite3ExprIfFalse((Parse *)pExpr_local,_jumpIfNull_local->pLeft,v._4_4_,(uint)v);
        sqlite3ExprIfFalse((Parse *)pExpr_local,_jumpIfNull_local->pRight,v._4_4_,(uint)v);
      }
      else {
        iVar3 = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
        sqlite3ExprIfTrue((Parse *)pExpr_local,_jumpIfNull_local->pLeft,iVar3,(uint)v ^ 0x10);
        sqlite3ExprIfFalse((Parse *)pExpr_local,_jumpIfNull_local->pRight,v._4_4_,(uint)v);
        sqlite3VdbeResolveLabel(_regFree1,iVar3);
      }
    }
    else {
      sqlite3ExprIfFalse((Parse *)pExpr_local,pExpr_00,v._4_4_,(uint)v);
    }
    break;
  case '-':
  case 0xa0:
    regFree2 = 0x35;
    if (pExpr->op == '-') {
      regFree2 = 0x34;
    }
    v._0_4_ = 0x80;
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    iVar3 = sqlite3ExprIsVector(pExpr->pLeft);
    if (iVar3 == 0) {
      iVar3 = sqlite3ExprCodeTemp((Parse *)pExpr_local,_jumpIfNull_local->pLeft,&r1);
      in2 = sqlite3ExprCodeTemp((Parse *)pExpr_local,_jumpIfNull_local->pRight,&r2);
      codeCompare((Parse *)pExpr_local,_jumpIfNull_local->pLeft,_jumpIfNull_local->pRight,regFree2,
                  iVar3,in2,v._4_4_,(uint)v);
    }
    else {
LAB_0022f291:
      if ((_jumpIfNull_local->flags & 0x20000001) == 0x20000000) {
        sqlite3VdbeGoto(_regFree1,v._4_4_);
      }
      else if ((_jumpIfNull_local->flags & 0x10000001) != 0x10000000) {
        iVar3 = sqlite3ExprCodeTemp((Parse *)pExpr_local,_jumpIfNull_local,&r1);
        sqlite3VdbeAddOp3(_regFree1,0x14,iVar3,v._4_4_,(uint)((uint)v != 0));
      }
    }
    break;
  case '0':
    exprCodeBetween(pParse,pExpr,dest,sqlite3ExprIfFalse,jumpIfNull);
    break;
  case '1':
    if (jumpIfNull == 0) {
      iVar3 = sqlite3VdbeMakeLabel(pParse);
      sqlite3ExprCodeIN((Parse *)pExpr_local,_jumpIfNull_local,v._4_4_,iVar3);
      sqlite3VdbeResolveLabel(_regFree1,iVar3);
    }
    else {
      sqlite3ExprCodeIN(pParse,pExpr,dest,dest);
    }
    break;
  case '2':
  case '3':
    iVar3 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&r1);
    sqlite3VdbeAddOp2(_regFree1,regFree2,iVar3,v._4_4_);
    break;
  case 0xa7:
    uVar1 = (uint)(pExpr->op2 == 0xa0);
    uVar2 = sqlite3ExprTruthValue(pExpr->pRight);
    if (uVar2 == uVar1) {
      iVar3 = 0x10;
      if (uVar1 != 0) {
        iVar3 = 0;
      }
      sqlite3ExprIfTrue((Parse *)pExpr_local,_jumpIfNull_local->pLeft,v._4_4_,iVar3);
    }
    else {
      iVar3 = 0x10;
      if (uVar1 != 0) {
        iVar3 = 0;
      }
      sqlite3ExprIfFalse((Parse *)pExpr_local,_jumpIfNull_local->pLeft,v._4_4_,iVar3);
    }
  }
  sqlite3ReleaseTempReg((Parse *)pExpr_local,r1);
  sqlite3ReleaseTempReg((Parse *)pExpr_local,r2);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfFalse(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) ) return; /* Existence of VDBE checked by caller */
  if( pExpr==0 )    return;

  /* The value of pExpr->op and op are related as follows:
  **
  **       pExpr->op            op
  **       ---------          ----------
  **       TK_ISNULL          OP_NotNull
  **       TK_NOTNULL         OP_IsNull
  **       TK_NE              OP_Eq
  **       TK_EQ              OP_Ne
  **       TK_GT              OP_Le
  **       TK_LE              OP_Gt
  **       TK_GE              OP_Lt
  **       TK_LT              OP_Ge
  **
  ** For other values of pExpr->op, op is undefined and unused.
  ** The value of TK_ and OP_ constants are arranged such that we
  ** can compute the mapping above using the following expression.
  ** Assert()s verify that the computation is correct.
  */
  op = ((pExpr->op+(TK_ISNULL&1))^1)-(TK_ISNULL&1);

  /* Verify correct alignment of TK_ and OP_ constants
  */
  assert( pExpr->op!=TK_ISNULL || op==OP_NotNull );
  assert( pExpr->op!=TK_NOTNULL || op==OP_IsNull );
  assert( pExpr->op!=TK_NE || op==OP_Eq );
  assert( pExpr->op!=TK_EQ || op==OP_Ne );
  assert( pExpr->op!=TK_LT || op==OP_Ge );
  assert( pExpr->op!=TK_LE || op==OP_Gt );
  assert( pExpr->op!=TK_GT || op==OP_Le );
  assert( pExpr->op!=TK_GE || op==OP_Lt );

  switch( pExpr->op ){
    case TK_AND:
    case TK_OR: {
      Expr *pAlt = sqlite3ExprSimplifiedAndOr(pExpr);
      if( pAlt!=pExpr ){
        sqlite3ExprIfFalse(pParse, pAlt, dest, jumpIfNull);
      }else if( pExpr->op==TK_AND ){
        testcase( jumpIfNull==0 );
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
        sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      }else{
        int d2 = sqlite3VdbeMakeLabel(pParse);
        testcase( jumpIfNull==0 );
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, d2,
                          jumpIfNull^SQLITE_JUMPIFNULL);
        sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
        sqlite3VdbeResolveLabel(v, d2);
      }
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_TRUTH: {
      int isNot;   /* IS NOT TRUE or IS NOT FALSE */
      int isTrue;  /* IS TRUE or IS NOT TRUE */
      testcase( jumpIfNull==0 );
      isNot = pExpr->op2==TK_ISNOT;
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      testcase( isTrue && isNot );
      testcase( !isTrue && isNot );
      if( isTrue ^ isNot ){
        /* IS TRUE and IS NOT FALSE */
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest,
                           isNot ? 0 : SQLITE_JUMPIFNULL);

      }else{
        /* IS FALSE and IS NOT TRUE */
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest,
                          isNot ? 0 : SQLITE_JUMPIFNULL);
      }
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_ISNOT );
      op = (pExpr->op==TK_IS) ? TK_NE : TK_EQ;
      jumpIfNull = SQLITE_NULLEQ;
      /* Fall thru */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      testcase( op==TK_ISNULL );   VdbeCoverageIf(v, op==TK_ISNULL);
      testcase( op==TK_NOTNULL );  VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfFalse, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      if( jumpIfNull ){
        sqlite3ExprCodeIN(pParse, pExpr, dest, dest);
      }else{
        int destIfNull = sqlite3VdbeMakeLabel(pParse);
        sqlite3ExprCodeIN(pParse, pExpr, dest, destIfNull);
        sqlite3VdbeResolveLabel(v, destIfNull);
      }
      break;
    }
#endif
    default: {
    default_expr: 
      if( ExprAlwaysFalse(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( ExprAlwaysTrue(pExpr) ){
        /* no-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_IfNot, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
}